

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeQuantizationTransform::TransformAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,PointAttribute *target_attribute)

{
  bool bVar1;
  PointAttribute *in_RCX;
  PointAttribute *in_stack_00000050;
  undefined4 in_stack_00000058;
  int in_stack_0000005c;
  undefined4 in_stack_00000060;
  int in_stack_00000064;
  PointAttribute *in_stack_00000068;
  AttributeQuantizationTransform *in_stack_00000070;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = std::
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          ::empty(in_stack_ffffffffffffffd0);
  if (bVar1) {
    PointAttribute::size(in_RCX);
    GeneratePortableAttribute
              (in_stack_00000070,in_stack_00000068,in_stack_00000064,
               (PointAttribute *)CONCAT44(in_stack_0000005c,in_stack_00000058));
  }
  else {
    PointAttribute::size(in_RCX);
    GeneratePortableAttribute
              (in_stack_00000070,in_stack_00000068,
               (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                *)CONCAT44(in_stack_00000064,in_stack_00000060),in_stack_0000005c,in_stack_00000050)
    ;
  }
  return true;
}

Assistant:

bool AttributeQuantizationTransform::TransformAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    PointAttribute *target_attribute) {
  if (point_ids.empty()) {
    GeneratePortableAttribute(attribute, target_attribute->size(),
                              target_attribute);
  } else {
    GeneratePortableAttribute(attribute, point_ids, target_attribute->size(),
                              target_attribute);
  }
  return true;
}